

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool function_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_function_t *f;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  ulong uVar2;
  long lVar3;
  gravity_class_t *pgVar4;
  uint uVar5;
  ulong uVar6;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [4096];
  
  if (args->isa == gravity_class_function) {
    f = (gravity_function_t *)(args->field_1).p;
    aVar1.p = (gravity_object_t *)gravity_closure_new(vm,f);
    uVar6 = (ulong)f->nparams;
    if (nargs < f->nparams) {
      uVar2 = (ulong)nargs;
      lVar3 = -uVar2;
      do {
        uVar5 = (int)uVar6 + (int)lVar3;
        args[uVar5].isa = gravity_class_null;
        args[uVar5].field_1.n = 1;
        uVar2 = uVar2 + 1;
        uVar6 = (ulong)f->nparams;
        lVar3 = lVar3 + -1;
      } while (uVar2 < uVar6);
    }
    pgVar4 = (aVar1.p)->isa;
  }
  else {
    builtin_strncpy(local_1028,"Unable to convert Object to closure",0x24);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    aVar1.n = 0;
    pgVar4 = gravity_class_null;
  }
  value.field_1.n = aVar1.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool function_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (!VALUE_ISA_FUNCTION(GET_VALUE(0))) RETURN_ERROR("Unable to convert Object to closure");
    
    gravity_function_t *func = VALUE_AS_FUNCTION(GET_VALUE(0));
    gravity_closure_t *closure = gravity_closure_new(vm, func);
    
    // fix the default arg values case
    // to be really correct and safe, stack size should be checked here but I know in advance that a minimum DEFAULT_MINSTACK_SIZE
    // is guaratee before calling a function, so just make sure that you do not use more than DEFAULT_MINSTACK_SIZE arguments
    // DEFAULT_MINSTACK_SIZE is 256 and in case of a 256 function arguments a maximum registers error would be returned
    // so I can assume to be always safe here
    while (nargs < func->nparams) {
        uint32_t index = (func->nparams - nargs);
        args[index] = VALUE_FROM_UNDEFINED;
        ++nargs;
    }
    
    RETURN_CLOSURE(VALUE_FROM_OBJECT(closure), rindex);
}